

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O2

string * tinyusdz::print_typed_attr<float>
                   (string *__return_storage_ptr__,
                   TypedAttribute<tinyusdz::Animatable<float>_> *attr,string *name,uint32_t indent)

{
  float fVar1;
  char cVar2;
  Path *v;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  value_type *pvVar7;
  ostream *poVar8;
  long lVar9;
  uint32_t indent_00;
  pointer pPVar10;
  uint32_t n;
  uint32_t n_00;
  uint32_t extraout_EDX;
  uint32_t extraout_EDX_00;
  uint32_t n_01;
  char *pcVar11;
  bool bVar12;
  bool bVar13;
  stringstream ss;
  string local_228;
  optional<tinyusdz::Animatable<float>_> local_208;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  bVar3 = TypedAttribute<tinyusdz::Animatable<float>_>::authored(attr);
  if (!bVar3) goto LAB_002527a9;
  bVar4 = TypedAttribute<tinyusdz::Animatable<float>_>::is_value_empty(attr);
  pPVar10 = (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  bVar12 = pPVar10 !=
           (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
           _M_impl.super__Vector_impl_data._M_start;
  bVar3 = (attr->_attrib).has_value_;
  nonstd::optional_lite::optional<tinyusdz::Animatable<float>_>::optional(&local_208,&attr->_attrib)
  ;
  if (local_208.has_value_ == true) {
    pvVar7 = nonstd::optional_lite::optional<tinyusdz::Animatable<float>_>::value(&local_208);
    cVar2 = pvVar7->_has_value;
  }
  else {
    cVar2 = '\0';
  }
  if ((local_208.has_value_ & 1U) == 0) {
    bVar5 = false;
  }
  else {
    pvVar7 = nonstd::optional_lite::optional<tinyusdz::Animatable<float>_>::value(&local_208);
    bVar5 = Animatable<float>::has_timesamples(pvVar7);
  }
  if ((((local_208.has_value_ & 1U) == 0) ||
      (pvVar7 = nonstd::optional_lite::optional<tinyusdz::Animatable<float>_>::value(&local_208),
      pvVar7->_blocked != false)) || (pvVar7->_has_value != false)) {
    bVar13 = false;
  }
  else {
    pPVar10 = (pointer)(pvVar7->_ts)._samples.
                       super__Vector_base<tinyusdz::TypedTimeSamples<float>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<float>::Sample>_>
                       ._M_impl.super__Vector_impl_data._M_start;
    bVar13 = pPVar10 !=
             (pointer)(pvVar7->_ts)._samples.
                      super__Vector_base<tinyusdz::TypedTimeSamples<float>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<float>::Sample>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
  }
  indent_00 = (uint32_t)pPVar10;
  bVar6 = AttrMetas::authored(&attr->_metas);
  if (((bVar6) || ((byte)(bVar12 & (bVar3 ^ 1U) | bVar13) != 1)) ||
     (n_01 = n, (bVar4 || attr->_blocked != false) || cVar2 != '\0')) {
    pprint::Indent_abi_cxx11_(&local_228,(pprint *)(ulong)indent,n);
    ::std::operator<<(local_1a8,(string *)&local_228);
    ::std::__cxx11::string::_M_dispose();
    value::TypeTraits<float>::type_name_abi_cxx11_();
    poVar8 = ::std::operator<<(local_1a8,(string *)&local_228);
    poVar8 = ::std::operator<<(poVar8," ");
    ::std::operator<<(poVar8,(string *)name);
    ::std::__cxx11::string::_M_dispose();
    if (attr->_blocked == true) {
      pcVar11 = " = None";
LAB_00252558:
      ::std::operator<<(local_1a8,pcVar11);
    }
    else if (cVar2 != '\0') {
      pvVar7 = nonstd::optional_lite::optional<tinyusdz::Animatable<float>_>::value(&local_208);
      if ((pvVar7->_blocked != false) || (pvVar7->_has_value != true)) {
        pcVar11 = " = [InternalError]";
        goto LAB_00252558;
      }
      fVar1 = pvVar7->_value;
      poVar8 = ::std::operator<<(local_1a8," = ");
      ::std::ostream::operator<<(poVar8,fVar1);
    }
    bVar3 = AttrMetas::authored(&attr->_metas);
    if (bVar3) {
      poVar8 = ::std::operator<<(local_1a8,"(\n");
      print_attr_metas_abi_cxx11_
                (&local_228,(tinyusdz *)attr,(AttrMeta *)(ulong)(indent + 1),indent_00);
      poVar8 = ::std::operator<<(poVar8,(string *)&local_228);
      pprint::Indent_abi_cxx11_(&local_1d8,(pprint *)(ulong)indent,n_00);
      poVar8 = ::std::operator<<(poVar8,(string *)&local_1d8);
      ::std::operator<<(poVar8,")");
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
    }
    ::std::operator<<(local_1a8,"\n");
    n_01 = extraout_EDX;
  }
  if (bVar5 != false) {
    pprint::Indent_abi_cxx11_(&local_228,(pprint *)(ulong)indent,n_01);
    ::std::operator<<(local_1a8,(string *)&local_228);
    ::std::__cxx11::string::_M_dispose();
    value::TypeTraits<float>::type_name_abi_cxx11_();
    poVar8 = ::std::operator<<(local_1a8,(string *)&local_228);
    poVar8 = ::std::operator<<(poVar8," ");
    ::std::operator<<(poVar8,(string *)name);
    ::std::__cxx11::string::_M_dispose();
    poVar8 = ::std::operator<<(local_1a8,".timeSamples = ");
    pvVar7 = nonstd::optional_lite::optional<tinyusdz::Animatable<float>_>::value(&local_208);
    print_typed_timesamples<float>(&local_228,&pvVar7->_ts,indent);
    ::std::operator<<(poVar8,(string *)&local_228);
    ::std::__cxx11::string::_M_dispose();
    ::std::operator<<(local_1a8,"\n");
    n_01 = extraout_EDX_00;
  }
  if ((attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
      super__Vector_impl_data._M_start) {
    pprint::Indent_abi_cxx11_(&local_228,(pprint *)(ulong)indent,n_01);
    ::std::operator<<(local_1a8,(string *)&local_228);
    ::std::__cxx11::string::_M_dispose();
    value::TypeTraits<float>::type_name_abi_cxx11_();
    poVar8 = ::std::operator<<(local_1a8,(string *)&local_228);
    poVar8 = ::std::operator<<(poVar8," ");
    ::std::operator<<(poVar8,(string *)name);
    ::std::__cxx11::string::_M_dispose();
    ::std::operator<<(local_1a8,".connect = ");
    v = (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
        super__Vector_impl_data._M_start;
    lVar9 = ((long)(attr->_paths).
                   super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)v) / 0xd0;
    if (lVar9 == 0) {
      ::std::operator<<(local_1a8,"[InternalError]");
    }
    else if (lVar9 == 1) {
      ::std::operator<<(local_1a8,v);
    }
    else {
      ::std::operator<<(local_1a8,&attr->_paths);
    }
    ::std::operator<<(local_1a8,"\n");
  }
  nonstd::optional_lite::optional<tinyusdz::Animatable<float>_>::~optional(&local_208);
LAB_002527a9:
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string print_typed_attr(const TypedAttribute<Animatable<T>> &attr,
                             const std::string &name, const uint32_t indent) {
  std::stringstream ss;

  if (attr.authored()) {

    bool is_value_empty = attr.is_value_empty();
    bool is_connection = attr.is_connection();
    bool has_default{false};
    bool has_timesamples{false};
    bool is_timesamples{false};
    const auto &pv = attr.get_value();

    has_default = (pv && pv.value().has_default());
    has_timesamples = (pv && pv.value().has_timesamples());
    is_timesamples = (pv && pv.value().is_timesamples());

    DCOUT("name " << name);
    DCOUT("is_value_empty " << is_value_empty);
    DCOUT("is_connection " << is_connection);
    DCOUT("is_timesamples " << is_timesamples);
    DCOUT("has_timesamples " << has_timesamples);
    DCOUT("has_default " << has_default);

    //
    // Emit default value(includes ValueBlock and empty definition) and metada
    //
    // float a METADATA
    // float a = None METADATA
    // float a = 1.5 METADATA
    // 
    // Also emit this line if the attribute contains metadata
    // Do not emit when Attribute is connection only or timesamples only.
    if (attr.metas().authored() || attr.is_blocked() || has_default || is_value_empty || ((!is_connection) && (!is_timesamples))) {

      ss << pprint::Indent(indent);
      ss << value::TypeTraits<T>::type_name() << " " << name;

      if (attr.is_blocked()) {
        ss << " = None";
      } else if (has_default) {
        T a;
        if (pv.value().get_scalar(&a)) {
          ss << " = " << a;
        } else {
          ss << " = [InternalError]";
        }
      } else { // is_value_empty
      }

      if (attr.metas().authored()) {
        ss << "(\n"
           << print_attr_metas(attr.metas(), indent + 1) << pprint::Indent(indent)
           << ")";
      }
      ss << "\n";
    }

    // timesamples
    if (has_timesamples) {
      ss << pprint::Indent(indent);
      ss << value::TypeTraits<T>::type_name() << " " << name;
      ss << ".timeSamples = "
         << print_typed_timesamples(pv.value().get_timesamples(), indent);
      ss << "\n";
    }

    // connection
    if (attr.has_connections()) {

      ss << pprint::Indent(indent);
      ss << value::TypeTraits<T>::type_name() << " " << name;

      ss << ".connect = ";
      const std::vector<Path> &paths = attr.get_connections();
      if (paths.size() == 1) {
        ss << paths[0];
      } else if (paths.size() == 0) {
        ss << "[InternalError]";
      } else {
        ss << paths;
      }
      ss << "\n";
    }

  }

  return ss.str();
}